

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyLinkError
               (NegativeTestContext *ctx,ShaderProgram *program)

{
  ShaderProgram *this;
  ProgramInfo *pPVar1;
  MessageBuilder *this_00;
  allocator<char> local_1e1;
  string local_1e0;
  MessageBuilder local_1b0;
  char *local_30;
  char *message;
  TestLog *log;
  ShaderProgram *pSStack_18;
  bool testFailed;
  ShaderProgram *program_local;
  NegativeTestContext *ctx_local;
  
  log._7_1_ = 0;
  pSStack_18 = program;
  program_local = (ShaderProgram *)ctx;
  message = (char *)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  glu::operator<<((TestLog *)message,pSStack_18);
  pPVar1 = glu::ShaderProgram::getProgramInfo(pSStack_18);
  log._7_1_ = pPVar1->linkOk & 1;
  if (log._7_1_ != 0) {
    local_30 = "Program was not expected to link.";
    tcu::TestLog::operator<<
              (&local_1b0,(TestLog *)message,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<(&local_1b0,&local_30);
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    this = program_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"Program was not expected to link.",&local_1e1);
    NegativeTestContext::fail((NegativeTestContext *)this,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
  }
  return;
}

Assistant:

void verifyLinkError (NegativeTestContext& ctx, const glu::ShaderProgram& program)
{
	bool testFailed = false;

	tcu::TestLog& log = ctx.getLog();
	log << program;

	testFailed = program.getProgramInfo().linkOk;

	if (testFailed)
	{
		const char* const message("Program was not expected to link.");
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}